

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

void duckdb::HTTPLoggingOutputSetting::SetLocal(ClientContext *context,Value *input)

{
  ClientConfig *pCVar1;
  string sStack_38;
  
  pCVar1 = ClientConfig::GetConfig(context);
  Value::GetValue<std::__cxx11::string>(&sStack_38,input);
  ::std::__cxx11::string::operator=((string *)&pCVar1->http_logging_output,(string *)&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void HTTPLoggingOutputSetting::SetLocal(ClientContext &context, const Value &input) {
	auto &config = ClientConfig::GetConfig(context);
	config.http_logging_output = input.GetValue<string>();
}